

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::APFloat::convertToInteger
          (APFloat *this,APSInt *result,roundingMode rounding_mode,bool *isExact)

{
  uint Width;
  opStatus oVar1;
  MutableArrayRef<unsigned_long> Input;
  ArrayRef<unsigned_long> bigVal;
  SmallVector<unsigned_long,_4U> parts;
  unsigned_long local_78;
  APInt local_70;
  undefined1 local_60 [4] [12];
  
  Width = *(uint *)(result + 8);
  local_78 = 0;
  SmallVector<unsigned_long,_4U>::SmallVector
            ((SmallVector<unsigned_long,_4U> *)local_60,(ulong)Width + 0x3f >> 6,&local_78);
  Input.super_ArrayRef<unsigned_long>.Length._4_4_ = 0;
  Input.super_ArrayRef<unsigned_long>._0_12_ = local_60[0];
  oVar1 = convertToInteger(this,Input,Width,(bool)((byte)result[0xc] ^ 1),rounding_mode,isExact);
  bigVal.Length._4_4_ = 0;
  bigVal._0_12_ = local_60[0];
  APInt::APInt(&local_70,Width,bigVal);
  APInt::operator=((APInt *)result,&local_70);
  APInt::~APInt(&local_70);
  SmallVectorImpl<unsigned_long>::~SmallVectorImpl((SmallVectorImpl<unsigned_long> *)local_60);
  return oVar1;
}

Assistant:

APFloat::opStatus APFloat::convertToInteger(APSInt &result,
                                            roundingMode rounding_mode,
                                            bool *isExact) const {
  unsigned bitWidth = result.getBitWidth();
  SmallVector<uint64_t, 4> parts(result.getNumWords());
  opStatus status = convertToInteger(parts, bitWidth, result.isSigned(),
                                     rounding_mode, isExact);
  // Keeps the original signed-ness.
  result = APInt(bitWidth, parts);
  return status;
}